

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O2

void __thiscall
NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::WriteInIndexFile(NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileName
                  ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileHash)

{
  char cVar1;
  ostream *poVar2;
  Logger *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ofstream index;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,(this->path->_M_dataplus)._M_p,&local_299);
  std::operator+(&local_298,&local_278,"/Index");
  std::ofstream::ofstream(&index,(string *)&local_298,_S_app);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  poVar2 = std::operator<<((ostream *)&index,"add");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)fileHash);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)fileName);
  std::endl<char,std::char_traits<char>>(poVar2);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    pLVar3 = Logger::getInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"Can\'t create new line",(allocator<char> *)&local_298);
    Logger::LogError(pLVar3,&local_258);
    this_00 = &local_258;
  }
  else {
    pLVar3 = Logger::getInstance();
    std::operator+(&local_278,"New line in Index file - add",fileHash);
    std::operator+(&local_298,&local_278," ");
    std::operator+(&local_238,&local_298,fileName);
    Logger::LogInformation(pLVar3,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_298);
    this_00 = &local_278;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::ofstream::close();
  std::ofstream::~ofstream(&index);
  return;
}

Assistant:

virtual void WriteInIndexFile(T fileName, T fileHash) {
        ofstream index(string(this->path->data()) + "/Index", ios_base::app);

        index << "add" << " " << fileHash << " " << fileName << endl;

        if (index.is_open()) {
            Logger::getInstance()->LogInformation("New line in Index file - add" + fileHash + " " + fileName);
        } else {
            Logger::getInstance()->LogError("Can't create new line");
        }

        index.close();
    }